

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

BuiltinFunction Func::GetBuiltInIndex(Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *pRVar4;
  SymOpnd *pSVar5;
  PropertySym *pPVar6;
  PropertySym *propertySym;
  Opnd *opnd_local;
  BuiltinFunction index;
  
  if (opnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x36c,"(opnd)","opnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Js::BuiltinFunction::BuiltinFunction((BuiltinFunction *)((long)&opnd_local + 7));
  bVar2 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar2) {
    pRVar4 = IR::Opnd::AsRegOpnd(opnd);
    opnd_local._7_1_ = (pRVar4->m_sym->m_builtInIndex)._value;
  }
  else {
    bVar2 = IR::Opnd::IsSymOpnd(opnd);
    if (bVar2) {
      pSVar5 = IR::Opnd::AsSymOpnd(opnd);
      pPVar6 = Sym::AsPropertySym(pSVar5->m_sym);
      opnd_local._7_1_ = Js::JavascriptLibrary::GetBuiltinFunctionForPropId(pPVar6->m_propertyId);
    }
    else {
      Js::BuiltinFunction::operator=((BuiltinFunction *)((long)&opnd_local + 7),None);
    }
  }
  return (BuiltinFunction)opnd_local._7_1_;
}

Assistant:

static Js::BuiltinFunction GetBuiltInIndex(IR::Opnd* opnd)
    {
        Assert(opnd);
        Js::BuiltinFunction index;
        if (opnd->IsRegOpnd())
        {
            index = opnd->AsRegOpnd()->m_sym->m_builtInIndex;
        }
        else if (opnd->IsSymOpnd())
        {
            PropertySym *propertySym = opnd->AsSymOpnd()->m_sym->AsPropertySym();
            index = Js::JavascriptLibrary::GetBuiltinFunctionForPropId(propertySym->m_propertyId);
        }
        else
        {
            index = Js::BuiltinFunction::None;
        }
        return index;
    }